

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void enet_protocol_remove_sent_unreliable_commands(ENetPeer *peer)

{
  ENetListIterator position;
  ENetOutgoingCommand *outgoingCommand;
  ENetPeer *peer_local;
  
  if ((peer->sentUnreliableCommands).sentinel.next != &(peer->sentUnreliableCommands).sentinel) {
    do {
      position = (peer->sentUnreliableCommands).sentinel.next;
      enet_list_remove(position);
      if ((position[5].previous != (_ENetListNode *)0x0) &&
         (*(int *)&position[5].previous[1].previous = *(int *)&position[5].previous[1].previous + -1
         , *(int *)&position[5].previous[1].previous == 0)) {
        *(uint *)&(position[5].previous)->next = *(uint *)&(position[5].previous)->next | 0x100;
        enet_packet_destroy((ENetPacket *)position[5].previous);
      }
      enet_free(position);
    } while ((peer->sentUnreliableCommands).sentinel.next !=
             &(peer->sentUnreliableCommands).sentinel);
    if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
        ((peer->outgoingCommands).sentinel.next == &(peer->outgoingCommands).sentinel)) &&
       ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel)) {
      enet_peer_disconnect(peer,peer->eventData);
    }
  }
  return;
}

Assistant:

static void enet_protocol_remove_sent_unreliable_commands(ENetPeer* peer) {
	ENetOutgoingCommand* outgoingCommand;

	if (enet_list_empty(&peer->sentUnreliableCommands))
		return;

	do {
		outgoingCommand = (ENetOutgoingCommand*)enet_list_front(&peer->sentUnreliableCommands);

		enet_list_remove(&outgoingCommand->outgoingCommandList);

		if (outgoingCommand->packet != NULL) {
			--outgoingCommand->packet->referenceCount;

			if (outgoingCommand->packet->referenceCount == 0) {
				outgoingCommand->packet->flags |= ENET_PACKET_FLAG_SENT;

				enet_packet_destroy(outgoingCommand->packet);
			}
		}

		enet_free(outgoingCommand);
	}

	while (!enet_list_empty(&peer->sentUnreliableCommands));

	if (peer->state == ENET_PEER_STATE_DISCONNECT_LATER && enet_list_empty(&peer->outgoingCommands) && enet_list_empty(&peer->sentReliableCommands))
		enet_peer_disconnect(peer, peer->eventData);
}